

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
CreateVertexTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          MeshAttributeIndicesEncodingData *encoding_data)

{
  pointer pIVar1;
  pointer piVar2;
  TraversalObserver traversal_observer;
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
  *this_00;
  MeshAttributeIndicesEncodingData *in_RDX;
  DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  att_traverser;
  DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  local_c8;
  
  this_00 = (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
             *)operator_new(0xc0);
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
  ::MeshTraversalSequencer
            (this_00,(Mesh *)(encoding_data->encoded_attribute_value_index_to_corner_map).
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RDX);
  pIVar1 = (encoding_data->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  piVar2 = (encoding_data->vertex_to_encoded_attribute_value_index_map).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::DepthFirstTraverser(&local_c8);
  traversal_observer.encoding_data_ = in_RDX;
  traversal_observer.att_connectivity_ = (CornerTable *)piVar2;
  traversal_observer.mesh_ = (Mesh *)pIVar1;
  traversal_observer.sequencer_ = (PointsSequencer *)this_00;
  TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::Init(&local_c8.
          super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
         ,(CornerTable *)
          (encoding_data->vertex_to_encoded_attribute_value_index_map).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start,
         traversal_observer);
  this_00->corner_order_ =
       (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        *)&encoding_data[2].num_values;
  DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::operator=(&this_00->traverser_,&local_c8);
  (this->super_MeshEdgebreakerEncoderImplInterface)._vptr_MeshEdgebreakerEncoderImplInterface =
       (_func_int **)this_00;
  DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::~DepthFirstTraverser(&local_c8);
  return (__uniq_ptr_data<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>,_true,_true>
          )(__uniq_ptr_data<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PointsSequencer>
MeshEdgebreakerEncoderImpl<TraversalEncoder>::CreateVertexTraversalSequencer(
    MeshAttributeIndicesEncodingData *encoding_data) {
  typedef typename TraverserT::TraversalObserver AttObserver;
  typedef typename TraverserT::CornerTable CornerTable;

  std::unique_ptr<MeshTraversalSequencer<TraverserT>> traversal_sequencer(
      new MeshTraversalSequencer<TraverserT>(mesh_, encoding_data));

  AttObserver att_observer(corner_table_.get(), mesh_,
                           traversal_sequencer.get(), encoding_data);

  TraverserT att_traverser;
  att_traverser.Init(corner_table_.get(), att_observer);

  // Set order of corners to simulate the corner order of the decoder.
  traversal_sequencer->SetCornerOrder(processed_connectivity_corners_);
  traversal_sequencer->SetTraverser(att_traverser);
  return std::move(traversal_sequencer);
}